

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O2

void ssh2_userauth_add_sigblob(ssh2_userauth_state *s,PktOut *pkt,ptrlen pkblob,ptrlen sigblob)

{
  BinarySink *bs;
  size_t len;
  _Bool _Var1;
  strbuf *buf;
  ulong uVar2;
  long lVar3;
  void *data;
  char *pcVar4;
  ptrlen pVar5;
  ptrlen pl;
  BinarySource sig [1];
  BinarySource pk [1];
  BinarySource local_88;
  BinarySource local_58;
  
  local_58.len = pkblob.len;
  local_58.data = pkblob.ptr;
  local_88.len = sigblob.len;
  data = sigblob.ptr;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_88.binarysource_ = &local_88;
  local_88.pos = 0;
  local_88.err = BSE_NO_ERROR;
  local_88.data = data;
  if (((s->ppl).remote_bugs & 0x10) != 0) {
    pVar5 = BinarySource_get_string(&local_58);
    _Var1 = ptrlen_eq_string(pVar5,"ssh-rsa");
    if (_Var1) {
      pVar5 = BinarySource_get_string(local_88.binarysource_);
      _Var1 = ptrlen_eq_string(pVar5,"ssh-rsa");
      if (_Var1) {
        BinarySource_get_string(local_58.binarysource_);
        pVar5 = BinarySource_get_string(local_58.binarysource_);
        len = local_88.pos;
        pcVar4 = (char *)pVar5.ptr;
        pl = BinarySource_get_string(local_88.binarysource_);
        uVar2 = pl.len;
        if (((local_58.binarysource_)->err == BSE_NO_ERROR) &&
           ((local_88.binarysource_)->err == BSE_NO_ERROR)) {
          for (lVar3 = -pVar5.len; lVar3 != 0; lVar3 = lVar3 + 1) {
            if (*pcVar4 != '\0') {
              if (uVar2 <= (ulong)-lVar3 && -uVar2 != lVar3) {
                buf = strbuf_new();
                bs = buf->binarysink_;
                BinarySink_put_data(bs,data,len);
                BinarySink_put_uint32(bs,-lVar3);
                BinarySink_put_padding(bs,-(uVar2 + lVar3),'\0');
                BinarySink_put_datapl(bs,pl);
                BinarySink_put_stringsb(pkt->binarysink_,buf);
                return;
              }
              break;
            }
            pcVar4 = pcVar4 + 1;
          }
        }
      }
    }
  }
  BinarySink_put_stringpl(pkt->binarysink_,sigblob);
  return;
}

Assistant:

static void ssh2_userauth_add_sigblob(
    struct ssh2_userauth_state *s, PktOut *pkt, ptrlen pkblob, ptrlen sigblob)
{
    BinarySource pk[1], sig[1];
    BinarySource_BARE_INIT_PL(pk, pkblob);
    BinarySource_BARE_INIT_PL(sig, sigblob);

    /* dmemdump(pkblob, pkblob_len); */
    /* dmemdump(sigblob, sigblob_len); */

    /*
     * See if this is in fact an ssh-rsa signature and a buggy
     * server; otherwise we can just do this the easy way.
     */
    if ((s->ppl.remote_bugs & BUG_SSH2_RSA_PADDING) &&
        ptrlen_eq_string(get_string(pk), "ssh-rsa") &&
        ptrlen_eq_string(get_string(sig), "ssh-rsa")) {
        ptrlen mod_mp, sig_mp;
        size_t sig_prefix_len;

        /*
         * Find the modulus and signature integers.
         */
        get_string(pk);                /* skip over exponent */
        mod_mp = get_string(pk);       /* remember modulus */
        sig_prefix_len = sig->pos;
        sig_mp = get_string(sig);
        if (get_err(pk) || get_err(sig))
            goto give_up;

        /*
         * Find the byte length of the modulus, not counting leading
         * zeroes.
         */
        while (mod_mp.len > 0 && *(const char *)mod_mp.ptr == 0) {
            mod_mp.len--;
            mod_mp.ptr = (const char *)mod_mp.ptr + 1;
        }

        /* debug("modulus length is %d\n", len); */
        /* debug("signature length is %d\n", siglen); */

        if (mod_mp.len > sig_mp.len) {
            strbuf *substr = strbuf_new();
            put_data(substr, sigblob.ptr, sig_prefix_len);
            put_uint32(substr, mod_mp.len);
            put_padding(substr, mod_mp.len - sig_mp.len, 0);
            put_datapl(substr, sig_mp);
            put_stringsb(pkt, substr);
            return;
        }

        /* Otherwise fall through and do it the easy way. We also come
         * here as a fallback if we discover above that the key blob
         * is misformatted in some way. */
      give_up:;
    }

    put_stringpl(pkt, sigblob);
}